

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O0

void __thiscall
lf::mesh::hybrid2d::Point::Point
          (Point *this,size_type index,
          unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry
          )

{
  bool bVar1;
  RefElType RVar2;
  RefElType RVar3;
  int iVar4;
  runtime_error *prVar5;
  pointer pGVar6;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  stringstream local_5b0 [8];
  stringstream ss_2;
  ostream local_5a0 [382];
  RefEl local_422;
  RefEl local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  stringstream local_3b0 [8];
  stringstream ss_1;
  ostream local_3a0 [376];
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *local_20;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry_local;
  Point *pPStack_10;
  size_type index_local;
  Point *this_local;
  
  local_20 = geometry;
  geometry_local._4_4_ = index;
  pPStack_10 = this;
  Entity::Entity(&this->super_Entity);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_Codim_00697880;
  this->index_ = geometry_local._4_4_;
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::unique_ptr
            (&this->geometry_,local_20);
  this->this_ = &this->super_Entity;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->geometry_);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Point must be supplied with a geometry");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"geometry_",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/point.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x3a,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pGVar6 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
           operator->(&this->geometry_);
  iVar4 = (**pGVar6->_vptr_Geometry)();
  if (iVar4 != 0) {
    std::__cxx11::stringstream::stringstream(local_3b0);
    std::operator<<(local_3a0,"Geometry must be that of a point");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"geometry_->DimLocal() == 0",&local_3d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/point.h"
               ,&local_3f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_3d0,&local_3f8,0x3c,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pGVar6 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
           operator->(&this->geometry_);
  iVar4 = (*pGVar6->_vptr_Geometry[2])();
  local_421.type_ = (RefElType)iVar4;
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_421);
  local_422 = lf::base::RefEl::kPoint();
  RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_422);
  if (RVar2 == RVar3) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_5b0);
  std::operator<<(local_5a0,"Geometry must fit point");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"geometry_->RefEl() == base::RefEl::kPoint()",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/point.h"
             ,&local_5f9);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_5d0,&local_5f8,0x3e,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"this code should not be reached");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit Point(size_type index,
                 std::unique_ptr<geometry::Geometry>&& geometry)
      : index_(index), geometry_(std::move(geometry)), this_(this) {
    // DIAGNOSTICS
    // std::cout << "hybrid2d::Point(" << index_ << ") " << std::endl;
    LF_VERIFY_MSG(geometry_, "Point must be supplied with a geometry");
    LF_VERIFY_MSG(geometry_->DimLocal() == 0,
                  "Geometry must be that of a point");
    LF_VERIFY_MSG(geometry_->RefEl() == base::RefEl::kPoint(),
                  "Geometry must fit point");
  }